

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O2

string * svg::attribute<char[3]>
                   (string *__return_storage_ptr__,string *attribute_name,char (*value) [3],
                   string *unit)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_1a8 [16];
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::operator<<(local_198,(string *)attribute_name);
  poVar1 = std::operator<<(poVar1,"=\"");
  poVar1 = std::operator<<(poVar1,*value);
  poVar1 = std::operator<<(poVar1,(string *)unit);
  std::operator<<(poVar1,"\" ");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string attribute(std::string const & attribute_name,
        T const & value, std::string const & unit = "")
    {
        std::stringstream ss;
        ss << attribute_name << "=\"" << value << unit << "\" ";
        return ss.str();
    }